

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_Not_OneSetOfIdenticalSequences_Open_Test::
TEST_DoublingFactorCounterTest_Not_OneSetOfIdenticalSequences_Open_Test
          (TEST_DoublingFactorCounterTest_Not_OneSetOfIdenticalSequences_Open_Test *this)

{
  TEST_DoublingFactorCounterTest_Not_OneSetOfIdenticalSequences_Open_Test *this_local;
  
  memset(this,0,0xc0);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest);
  (this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).super_Utest._vptr_Utest =
       (_func_int **)
       &PTR__TEST_DoublingFactorCounterTest_Not_OneSetOfIdenticalSequences_Open_Test_00251c18;
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, Not_OneSetOfIdenticalSequences_Open)
{
	addPair(Tile::SouthWind);	
	addSequence(Tile::OneOfCharacters, false);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfCircles, false);	
	addTriplet(Tile::NineOfBamboos, true);

	s.selfDrawn();
	auto r = c.report();

	CHECK(r.patterns.empty());
}